

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
write_int<unsigned_long_long>
          (arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this,
          unsigned_long_long value,format_specs *spec)

{
  byte bVar1;
  int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>
  local_38;
  
  local_38.out.container = (this->out_).container;
  local_38.locale.locale_ = (this->locale_).locale_;
  local_38.prefix_size = 0;
  bVar1 = (byte)spec->field_0x9 >> 4 & 7;
  if (1 < bVar1) {
    local_38.prefix[0] = ' ';
    if (bVar1 == 2) {
      local_38.prefix[0] = '+';
    }
    local_38.prefix_size = 1;
  }
  local_38.specs = spec;
  local_38.abs_value = value;
  handle_int_type_spec<fmt::v6::detail::int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned_long>&>
            (spec->type,&local_38);
  (this->out_).container = local_38.out.container;
  return;
}

Assistant:

void write_int(T value, const format_specs& spec) {
    using uint_type = uint32_or_64_or_128_t<T>;
    int_writer<iterator, char_type, uint_type> w(out_, locale_, value, spec);
    handle_int_type_spec(spec.type, w);
    out_ = w.out;
  }